

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O3

void deqp::gles31::Functional::anon_unknown_0::
     generateBufferVariableMatrixCases<(deqp::gles31::Functional::ProgramResourcePropFlags)128>
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup,
               bool extendedTypeCases)

{
  Node *pNVar1;
  SharedPtrStateBase *pSVar2;
  TestNode *pTVar3;
  Node *pNVar4;
  SharedPtrStateBase *pSVar5;
  undefined7 in_register_00000009;
  deInt32 *pdVar6;
  SharedPtr matrixOrder;
  SharedPtr local_58;
  _func_int **local_44 [2];
  MatrixOrder local_34;
  
  if ((int)CONCAT71(in_register_00000009,extendedTypeCases) != 0) {
    pTVar3 = (TestNode *)operator_new(0x78);
    tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar3,context->m_testCtx,"types","Types");
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_02155970;
    pTVar3[1]._vptr_TestNode = (_func_int **)context;
    tcu::TestNode::addChild(&targetGroup->super_TestNode,pTVar3);
    generateBufferVariableMatrixVariableBasicTypeCases
              (context,parentStructure,(TestCaseGroup *)pTVar3,PROGRAMRESOURCEPROP_MATRIX_STRIDE);
  }
  pTVar3 = (TestNode *)operator_new(0x78);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,context->m_testCtx,"no_qualifier","No qualifier");
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_02155970;
  pTVar3[1]._vptr_TestNode = (_func_int **)context;
  tcu::TestNode::addChild(&targetGroup->super_TestNode,pTVar3);
  generateBufferVariableMatrixVariableCases
            (context,parentStructure,(TestCaseGroup *)pTVar3,PROGRAMRESOURCEPROP_MATRIX_STRIDE);
  pNVar4 = (Node *)operator_new(0x38);
  glu::Layout::Layout((Layout *)local_44,-1,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_COLUMN_MAJOR);
  pNVar1 = parentStructure->m_ptr;
  pSVar2 = parentStructure->m_state;
  pNVar4->_vptr_Node = (_func_int **)&PTR__Node_02160298;
  pNVar4->m_type = TYPE_LAYOUT_QUALIFIER;
  (pNVar4->m_enclosingNode).m_ptr = pNVar1;
  (pNVar4->m_enclosingNode).m_state = pSVar2;
  if (pSVar2 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pSVar2->strongRefCount = pSVar2->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar6 = &((pNVar4->m_enclosingNode).m_state)->weakRefCount;
    *pdVar6 = *pdVar6 + 1;
    UNLOCK();
  }
  pNVar4->_vptr_Node = (_func_int **)&PTR__Node_02160530;
  pNVar4[1]._vptr_Node = local_44[0];
  *(_func_int ***)&pNVar4[1].m_type = local_44[1];
  *(MatrixOrder *)&pNVar4[1].m_enclosingNode.m_ptr = local_34;
  local_58.m_state = (SharedPtrStateBase *)0x0;
  local_58.m_ptr = pNVar4;
  pSVar5 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar5->strongRefCount = 0;
  pSVar5->weakRefCount = 0;
  pSVar5->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021602b8;
  pSVar5[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar4;
  pSVar5->strongRefCount = 1;
  pSVar5->weakRefCount = 1;
  local_58.m_state = pSVar5;
  pTVar3 = (TestNode *)operator_new(0x78);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,context->m_testCtx,"column_major","Column major qualifier");
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_02155970;
  pTVar3[1]._vptr_TestNode = (_func_int **)context;
  tcu::TestNode::addChild(&targetGroup->super_TestNode,pTVar3);
  generateBufferVariableMatrixVariableCases
            (context,&local_58,(TestCaseGroup *)pTVar3,PROGRAMRESOURCEPROP_MATRIX_STRIDE);
  pSVar2 = local_58.m_state;
  pdVar6 = &pSVar5->strongRefCount;
  LOCK();
  *pdVar6 = *pdVar6 + -1;
  UNLOCK();
  if (*pdVar6 == 0) {
    local_58.m_ptr = (Node *)0x0;
    (*(local_58.m_state)->_vptr_SharedPtrStateBase[2])(local_58.m_state);
  }
  LOCK();
  pdVar6 = &pSVar2->weakRefCount;
  *pdVar6 = *pdVar6 + -1;
  UNLOCK();
  if ((*pdVar6 == 0) && (local_58.m_state != (SharedPtrStateBase *)0x0)) {
    (*(local_58.m_state)->_vptr_SharedPtrStateBase[1])();
  }
  pNVar4 = (Node *)operator_new(0x38);
  glu::Layout::Layout((Layout *)local_44,-1,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_ROW_MAJOR);
  pNVar1 = parentStructure->m_ptr;
  pSVar2 = parentStructure->m_state;
  pNVar4->_vptr_Node = (_func_int **)&PTR__Node_02160298;
  pNVar4->m_type = TYPE_LAYOUT_QUALIFIER;
  (pNVar4->m_enclosingNode).m_ptr = pNVar1;
  (pNVar4->m_enclosingNode).m_state = pSVar2;
  if (pSVar2 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pSVar2->strongRefCount = pSVar2->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar6 = &((pNVar4->m_enclosingNode).m_state)->weakRefCount;
    *pdVar6 = *pdVar6 + 1;
    UNLOCK();
  }
  pNVar4->_vptr_Node = (_func_int **)&PTR__Node_02160530;
  pNVar4[1]._vptr_Node = local_44[0];
  *(_func_int ***)&pNVar4[1].m_type = local_44[1];
  *(MatrixOrder *)&pNVar4[1].m_enclosingNode.m_ptr = local_34;
  local_58.m_state = (SharedPtrStateBase *)0x0;
  local_58.m_ptr = pNVar4;
  pSVar5 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar5->strongRefCount = 0;
  pSVar5->weakRefCount = 0;
  pSVar5->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021602b8;
  pSVar5[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar4;
  pSVar5->strongRefCount = 1;
  pSVar5->weakRefCount = 1;
  local_58.m_state = pSVar5;
  pTVar3 = (TestNode *)operator_new(0x78);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,context->m_testCtx,"row_major","Row major qualifier");
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_02155970;
  pTVar3[1]._vptr_TestNode = (_func_int **)context;
  tcu::TestNode::addChild(&targetGroup->super_TestNode,pTVar3);
  generateBufferVariableMatrixVariableCases
            (context,&local_58,(TestCaseGroup *)pTVar3,PROGRAMRESOURCEPROP_MATRIX_STRIDE);
  pSVar2 = local_58.m_state;
  pdVar6 = &pSVar5->strongRefCount;
  LOCK();
  *pdVar6 = *pdVar6 + -1;
  UNLOCK();
  if (*pdVar6 == 0) {
    local_58.m_ptr = (Node *)0x0;
    (*(local_58.m_state)->_vptr_SharedPtrStateBase[2])(local_58.m_state);
  }
  LOCK();
  pdVar6 = &pSVar2->weakRefCount;
  *pdVar6 = *pdVar6 + -1;
  UNLOCK();
  if ((*pdVar6 == 0) && (local_58.m_state != (SharedPtrStateBase *)0x0)) {
    (*(local_58.m_state)->_vptr_SharedPtrStateBase[1])();
  }
  return;
}

Assistant:

static void generateBufferVariableMatrixCases (Context& context, const ResourceDefinition::Node::SharedPtr& parentStructure, tcu::TestCaseGroup* targetGroup, bool extendedTypeCases)
{
	// .types
	if (extendedTypeCases)
	{
		tcu::TestCaseGroup* const blockGroup = new TestCaseGroup(context, "types", "Types");
		targetGroup->addChild(blockGroup);
		generateBufferVariableMatrixVariableBasicTypeCases(context, parentStructure, blockGroup, TargetProp);
	}

	// .no_qualifier
	{
		tcu::TestCaseGroup* const blockGroup = new TestCaseGroup(context, "no_qualifier", "No qualifier");
		targetGroup->addChild(blockGroup);
		generateBufferVariableMatrixVariableCases(context, parentStructure, blockGroup, TargetProp);
	}

	// .column_major
	{
		const ResourceDefinition::Node::SharedPtr matrixOrder(new ResourceDefinition::LayoutQualifier(parentStructure, glu::Layout(-1, -1, -1, glu::FORMATLAYOUT_LAST, glu::MATRIXORDER_COLUMN_MAJOR)));

		tcu::TestCaseGroup* const blockGroup = new TestCaseGroup(context, "column_major", "Column major qualifier");
		targetGroup->addChild(blockGroup);
		generateBufferVariableMatrixVariableCases(context, matrixOrder, blockGroup, TargetProp);
	}

	// .row_major
	{
		const ResourceDefinition::Node::SharedPtr matrixOrder(new ResourceDefinition::LayoutQualifier(parentStructure, glu::Layout(-1, -1, -1, glu::FORMATLAYOUT_LAST, glu::MATRIXORDER_ROW_MAJOR)));

		tcu::TestCaseGroup* const blockGroup = new TestCaseGroup(context, "row_major", "Row major qualifier");
		targetGroup->addChild(blockGroup);
		generateBufferVariableMatrixVariableCases(context, matrixOrder, blockGroup, TargetProp);
	}
}